

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::CheckVersion(cmFindPackageCommand *this,string *config_file)

{
  undefined1 uVar1;
  bool bVar2;
  ulong uVar3;
  undefined1 local_1c0 [8];
  ConfigFileInfo configFileInfo;
  cmAlphaNum local_150;
  string local_120;
  cmAlphaNum local_100;
  cmAlphaNum local_d0;
  undefined1 local_a0 [8];
  string version_file;
  string version_file_base;
  size_type pos;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string version;
  bool haveResult;
  bool result;
  string *config_file_local;
  cmFindPackageCommand *this_local;
  
  version.field_2._M_local_buf[0xf] = '\0';
  version.field_2._M_local_buf[0xe] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"unknown",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::rfind((char)config_file,0x2e);
  std::__cxx11::string::substr((ulong)((long)&version_file.field_2 + 8),(ulong)config_file);
  cmAlphaNum::cmAlphaNum(&local_d0,(string *)((long)&version_file.field_2 + 8));
  cmAlphaNum::cmAlphaNum(&local_100,"-version.cmake");
  cmStrCat<>((string *)local_a0,&local_d0,&local_100);
  if (((version.field_2._M_local_buf[0xe] & 1U) == 0) &&
     (bVar2 = cmsys::SystemTools::FileExists((string *)local_a0,true), bVar2)) {
    version.field_2._M_local_buf[0xf] = CheckVersionFile(this,(string *)local_a0,(string *)local_40)
    ;
    version.field_2._M_local_buf[0xe] = '\x01';
  }
  cmAlphaNum::cmAlphaNum(&local_150,(string *)((long)&version_file.field_2 + 8));
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&configFileInfo.version.field_2 + 8),"Version.cmake");
  cmStrCat<>(&local_120,&local_150,(cmAlphaNum *)((long)&configFileInfo.version.field_2 + 8));
  std::__cxx11::string::operator=((string *)local_a0,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  if (((version.field_2._M_local_buf[0xe] & 1U) == 0) &&
     (bVar2 = cmsys::SystemTools::FileExists((string *)local_a0,true), bVar2)) {
    version.field_2._M_local_buf[0xf] = CheckVersionFile(this,(string *)local_a0,(string *)local_40)
    ;
    version.field_2._M_local_buf[0xe] = '\x01';
  }
  if (((version.field_2._M_local_buf[0xe] & 1U) == 0) &&
     (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
    version.field_2._M_local_buf[0xf] = '\x01';
  }
  ConfigFileInfo::ConfigFileInfo((ConfigFileInfo *)local_1c0);
  std::__cxx11::string::operator=((string *)local_1c0,(string *)config_file);
  std::__cxx11::string::operator=
            ((string *)(configFileInfo.filename.field_2._M_local_buf + 8),(string *)local_40);
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::push_back(&this->ConsideredConfigs,(value_type *)local_1c0);
  uVar1 = version.field_2._M_local_buf[0xf];
  ConfigFileInfo::~ConfigFileInfo((ConfigFileInfo *)local_1c0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(version_file.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_40);
  return (bool)(uVar1 & 1);
}

Assistant:

bool cmFindPackageCommand::CheckVersion(std::string const& config_file)
{
  bool result = false; // by default, assume the version is not ok.
  bool haveResult = false;
  std::string version = "unknown";

  // Get the filename without the .cmake extension.
  std::string::size_type pos = config_file.rfind('.');
  std::string version_file_base = config_file.substr(0, pos);

  // Look for foo-config-version.cmake
  std::string version_file = cmStrCat(version_file_base, "-version.cmake");
  if (!haveResult && cmSystemTools::FileExists(version_file, true)) {
    result = this->CheckVersionFile(version_file, version);
    haveResult = true;
  }

  // Look for fooConfigVersion.cmake
  version_file = cmStrCat(version_file_base, "Version.cmake");
  if (!haveResult && cmSystemTools::FileExists(version_file, true)) {
    result = this->CheckVersionFile(version_file, version);
    haveResult = true;
  }

  // If no version was requested a versionless package is acceptable.
  if (!haveResult && this->Version.empty()) {
    result = true;
  }

  ConfigFileInfo configFileInfo;
  configFileInfo.filename = config_file;
  configFileInfo.version = version;
  this->ConsideredConfigs.push_back(std::move(configFileInfo));

  return result;
}